

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::BondTypesSectionParser::parseLine
          (BondTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  BondType *pBVar2;
  uint in_ECX;
  string *in_RDX;
  string *at1_00;
  BondTypeParser *in_stack_00000030;
  OpenMDException *e;
  RealType kScale;
  string remainder;
  string at2;
  string at1;
  int nTokens;
  BondType *bondType;
  BondTypeParser btParser;
  StringTokenizer tokenizer;
  RealType in_stack_00000300;
  string *in_stack_00000308;
  BondTypeParser *in_stack_00000310;
  StringTokenizer *in_stack_fffffffffffffe60;
  StringTokenizer *in_stack_fffffffffffffe70;
  string *str;
  StringTokenizer *in_stack_fffffffffffffea0;
  ForceField *in_stack_fffffffffffffeb0;
  StringTokenizer *in_stack_fffffffffffffec8;
  string local_130 [32];
  string local_110 [24];
  StringTokenizer *in_stack_ffffffffffffff08;
  undefined1 local_99 [125];
  uint local_1c;
  
  str = (string *)local_99;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffea0->tokenString_,(char *)str,(allocator<char> *)in_RDX);
  StringTokenizer::StringTokenizer(in_stack_fffffffffffffea0,str,in_RDX);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  BondTypeParser::BondTypeParser(in_stack_00000030);
  iVar1 = StringTokenizer::countTokens(in_stack_fffffffffffffe70);
  if (iVar1 < 4) {
    snprintf(painCave.errMsg,2000,"BondTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    painCave.isFatal = 1;
    simError();
  }
  StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff08);
  StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff08);
  StringTokenizer::getRemainingString_abi_cxx11_(in_stack_fffffffffffffec8);
  at1_00 = (string *)ForceFieldOptions::getBondForceConstantScaling((ForceFieldOptions *)0x261060);
  pBVar2 = BondTypeParser::parseLine(in_stack_00000310,in_stack_00000308,in_stack_00000300);
  if (pBVar2 != (BondType *)0x0) {
    ForceField::addBondType
              (in_stack_fffffffffffffeb0,at1_00,&in_stack_fffffffffffffea0->tokenString_,
               (BondType *)str);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_110);
  BondTypeParser::~BondTypeParser((BondTypeParser *)0x2611fd);
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffe60);
  return;
}

Assistant:

void BondTypesSectionParser::parseLine(ForceField& ff,
                                         const std::string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    BondTypeParser btParser;
    BondType* bondType = NULL;
    int nTokens        = tokenizer.countTokens();

    if (nTokens < 4) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();
    RealType kScale       = options_.getBondForceConstantScaling();

    try {
      bondType = btParser.parseLine(remainder, kScale);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (bondType != NULL) { ff.addBondType(at1, at2, bondType); }
  }